

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::push_ext_meshes(level_tools *this,level_mesh *mesh)

{
  uint uVar1;
  cse_abstract *pcVar2;
  xr_gamemtls_lib *this_00;
  bool bVar3;
  uint16_t sector;
  uint16_t uVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  xr_level_spawn *pxVar10;
  xr_gamemtl *pxVar11;
  size_type sVar12;
  size_type sVar13;
  vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_> *this_01;
  vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_> *this_02;
  reference ppcVar14;
  string *psVar15;
  fvector3 *pfVar16;
  undefined4 extraout_var;
  shape_def_vec *this_03;
  reference shape;
  xr_bone_vec *pxVar17;
  const_reference ppxVar18;
  char *name;
  undefined8 uVar19;
  xr_ogf_vec *pxVar20;
  reference ppxVar21;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
  local_f0;
  const_iterator local_e8;
  const_iterator local_e0;
  xr_ogf *local_d8;
  xr_ogf *ogf1;
  xr_ogf_vec_cit end1;
  xr_ogf_vec_cit it1;
  undefined1 local_b8 [6];
  uint16_t sector_idx;
  fmatrix xform;
  cse_abstract *entity;
  xr_ogf *ogf;
  xr_entity_vec_it end;
  xr_entity_vec_it it;
  xr_entity_vec_it last;
  xr_entity_vec *spawns;
  xr_ogf_vec_cit brkbl_it;
  size_t shader_hint;
  size_t texture_hint;
  uint16_t clmbl_gamemtl;
  xr_gamemtl *gamemtl;
  level_mesh *mesh_local;
  level_tools *this_local;
  
  pxVar10 = xray_re::xr_level::spawn(this->m_level);
  if (pxVar10 != (xr_level_spawn *)0x0) {
    pxVar11 = xray_re::xr_gamemtls_lib::get_material(this->m_gamemtls_lib,this->m_ladders_gamemtl);
    if (pxVar11 == (xr_gamemtl *)0x0) {
      __assert_fail("gamemtl",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x172,"void level_tools::push_ext_meshes(level_mesh *)");
    }
    uVar1 = pxVar11->id;
    sVar12 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(this->m_textures);
    sVar13 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(this->m_shaders);
    brkbl_it._M_current = (xr_ogf **)(sVar13 - 1);
    this_01 = xray_re::xr_level::brkbl_meshes(this->m_level);
    spawns = (xr_entity_vec *)
             std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin(this_01);
    pxVar10 = xray_re::xr_level::spawn(this->m_level);
    this_02 = xray_re::xr_level_spawn::spawns(pxVar10);
    end._M_current =
         (cse_abstract **)
         std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::begin
                   (this_02);
    it._M_current = end._M_current;
    ogf = (xr_ogf *)
          std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::end
                    (this_02);
    while (bVar3 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                                    *)&ogf), bVar3) {
      ppcVar14 = __gnu_cxx::
                 __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                 ::operator*(&end);
      pcVar2 = *ppcVar14;
      psVar15 = xray_re::cse_abstract::name_abi_cxx11_(pcVar2);
      bVar3 = std::operator==(psVar15,"breakable_object");
      if (bVar3) {
        xform.field_0._56_8_ =
             __gnu_cxx::
             __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
             ::operator++((__normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                           *)&spawns,0);
        ppxVar21 = __gnu_cxx::
                   __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                   ::operator*((__normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                                *)((long)&xform.field_0.field_1.c.field_0 + 8));
        entity = (cse_abstract *)*ppxVar21;
LAB_0016761e:
        pfVar16 = xray_re::cse_abstract::rotation(pcVar2);
        xray_re::_matrix<float>::set_xyz((_matrix<float> *)local_b8,pfVar16);
        pfVar16 = xray_re::cse_abstract::position(pcVar2);
        xray_re::_vector3<float>::set<float>
                  ((_vector3<float> *)((long)&xform.field_0.field_1.k.field_0 + 8),pfVar16);
        pfVar16 = xray_re::cse_abstract::position(pcVar2);
        sector = get_sector_idx(this,pfVar16);
        if (entity == (cse_abstract *)0x0) {
          iVar6 = (*pcVar2->_vptr_cse_abstract[7])();
          this_03 = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var,iVar6));
          shape = std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::front
                            (this_03);
          level_mesh::push(mesh,sector,shape,(fmatrix *)local_b8,0,0,(uint16_t)uVar1);
LAB_001679fc:
          if (pcVar2 != (cse_abstract *)0x0) {
            (*pcVar2->_vptr_cse_abstract[1])();
          }
        }
        else {
          pxVar17 = xray_re::xr_object::bones((xr_object *)entity);
          bVar3 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::empty
                            (pxVar17);
          if (bVar3) {
            xray_re::xr_ogf::path_abi_cxx11_((xr_ogf *)entity);
            uVar19 = std::__cxx11::string::c_str();
            xray_re::msg("empty skeleton in %s",uVar19);
          }
          else {
            this_00 = this->m_gamemtls_lib;
            pxVar17 = xray_re::xr_object::bones((xr_object *)entity);
            ppxVar18 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::front
                                 (pxVar17);
            xray_re::xr_bone::gamemtl_abi_cxx11_(*ppxVar18);
            name = (char *)std::__cxx11::string::c_str();
            pxVar11 = xray_re::xr_gamemtls_lib::get_material(this_00,name);
            if (pxVar11 != (xr_gamemtl *)0x0) {
              uVar7 = (*entity->_vptr_cse_abstract[0x16])();
              if ((uVar7 & 1) == 0) {
                iVar6 = (*entity->_vptr_cse_abstract[0x1f])();
                iVar8 = (*entity->_vptr_cse_abstract[0x20])();
                iVar9 = (*entity->_vptr_cse_abstract[0x1b])();
                uVar4 = add_texture(this,(string *)CONCAT44(extraout_var_06,iVar9),sVar12 - 1);
                iVar9 = (*entity->_vptr_cse_abstract[0x1c])();
                uVar5 = add_shader(this,(string *)CONCAT44(extraout_var_07,iVar9),
                                   (size_t)brkbl_it._M_current);
                level_mesh::push(mesh,sector,(xr_vbuf *)CONCAT44(extraout_var_04,iVar6),
                                 (xr_ibuf *)CONCAT44(extraout_var_05,iVar8),(fmatrix *)local_b8,
                                 uVar4,uVar5,(uint16_t)pxVar11->id);
              }
              else {
                pxVar20 = xray_re::xr_ogf::children((xr_ogf *)entity);
                end1._M_current =
                     (xr_ogf **)
                     std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin
                               (pxVar20);
                pxVar20 = xray_re::xr_ogf::children((xr_ogf *)entity);
                ogf1 = (xr_ogf *)
                       std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::end
                                 (pxVar20);
                while (bVar3 = __gnu_cxx::operator!=
                                         (&end1,(__normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                                                 *)&ogf1), bVar3) {
                  ppxVar21 = __gnu_cxx::
                             __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                             ::operator*(&end1);
                  local_d8 = *ppxVar21;
                  iVar6 = (*(local_d8->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1f])();
                  iVar8 = (*(local_d8->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x20])();
                  iVar9 = (*(local_d8->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1b])();
                  uVar4 = add_texture(this,(string *)CONCAT44(extraout_var_02,iVar9),sVar12 - 1);
                  iVar9 = (*(local_d8->super_xr_object).super_xr_surface_factory.
                            _vptr_xr_surface_factory[0x1c])();
                  uVar5 = add_shader(this,(string *)CONCAT44(extraout_var_03,iVar9),
                                     (size_t)brkbl_it._M_current);
                  level_mesh::push(mesh,sector,(xr_vbuf *)CONCAT44(extraout_var_00,iVar6),
                                   (xr_ibuf *)CONCAT44(extraout_var_01,iVar8),(fmatrix *)local_b8,
                                   uVar4,uVar5,(uint16_t)pxVar11->id);
                  __gnu_cxx::
                  __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                  ::operator++(&end1);
                }
              }
              goto LAB_001679fc;
            }
            pxVar17 = xray_re::xr_object::bones((xr_object *)entity);
            ppxVar18 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::front
                                 (pxVar17);
            xray_re::xr_bone::gamemtl_abi_cxx11_(*ppxVar18);
            uVar19 = std::__cxx11::string::c_str();
            xray_re::msg("can\'t resolve game material %s",uVar19);
          }
        }
      }
      else {
        psVar15 = xray_re::cse_abstract::name_abi_cxx11_(pcVar2);
        bVar3 = std::operator==(psVar15,"climable_object");
        if (bVar3) {
          entity = (cse_abstract *)0x0;
          goto LAB_0016761e;
        }
        bVar3 = __gnu_cxx::operator!=(&it,&end);
        if (bVar3) {
          ppcVar14 = __gnu_cxx::
                     __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                     ::operator*(&end);
          pcVar2 = *ppcVar14;
          ppcVar14 = __gnu_cxx::
                     __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                     ::operator*(&it);
          *ppcVar14 = pcVar2;
        }
        __gnu_cxx::
        __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
        ::operator++(&it);
      }
      __gnu_cxx::
      __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
      ::operator++(&end);
    }
    __gnu_cxx::
    __normal_iterator<xray_re::cse_abstract*const*,std::vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>>>
    ::__normal_iterator<xray_re::cse_abstract**>
              ((__normal_iterator<xray_re::cse_abstract*const*,std::vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>>>
                *)&local_e0,&it);
    local_f0._M_current =
         (cse_abstract **)
         std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::end
                   (this_02);
    __gnu_cxx::
    __normal_iterator<xray_re::cse_abstract*const*,std::vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>>>
    ::__normal_iterator<xray_re::cse_abstract**>
              ((__normal_iterator<xray_re::cse_abstract*const*,std::vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>>>
                *)&local_e8,&local_f0);
    std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::erase
              (this_02,local_e0,local_e8);
  }
  return;
}

Assistant:

void level_tools::push_ext_meshes(level_mesh* mesh)
{
	if (m_level->spawn() == 0)
		return;
	const xr_gamemtl* gamemtl = m_gamemtls_lib->get_material(m_ladders_gamemtl);
	xr_assert(gamemtl);
	uint16_t clmbl_gamemtl = gamemtl->id;
	size_t texture_hint = m_textures->size() - 1;
	size_t shader_hint = m_shaders->size() - 1;
	xr_ogf_vec_cit brkbl_it = m_level->brkbl_meshes().begin();;
	xr_entity_vec& spawns = m_level->spawn()->spawns();
	xr_entity_vec_it last = spawns.begin();
	for (xr_entity_vec_it it = last, end = spawns.end(); it != end; ++it) {
		const xr_ogf* ogf;
		cse_abstract* entity = *it;
		if (entity->name() == "breakable_object") {
			ogf = *brkbl_it++;
		} else if (entity->name() == "climable_object") {
			ogf = 0;
		} else {
			if (last != it)
				*last = *it;
			++last;
			continue;
		}

		fmatrix xform;
		xform.set_xyz(entity->rotation());
		xform.c.set(entity->position());

		uint16_t sector_idx = get_sector_idx(entity->position());

		if (ogf == 0) {
			mesh->push(sector_idx, entity->shape()->shapes().front(), xform,
					0, 0, clmbl_gamemtl);
		} else {
			if (ogf->bones().empty()) {
				msg("empty skeleton in %s", ogf->path().c_str());
				goto skip;
			}
			// FIXME: what if there are many different materials?
			gamemtl = m_gamemtls_lib->get_material(ogf->bones().front()->gamemtl().c_str());
			if (gamemtl == 0) {
				msg("can't resolve game material %s", ogf->bones().front()->gamemtl().c_str());
				goto skip;
			}
			if (ogf->hierarchical()) {
				for (xr_ogf_vec_cit it1 = ogf->children().begin(),
						end1 = ogf->children().end(); it1 != end1; ++it1) {
					const xr_ogf* ogf1 = static_cast<const xr_ogf*>(*it1);
					mesh->push(sector_idx, ogf1->vb(), ogf1->ib(), xform,
							add_texture(ogf1->texture(), texture_hint),
							add_shader(ogf1->shader(), shader_hint),
							gamemtl->id);
				}
			} else {
				mesh->push(sector_idx, ogf->vb(), ogf->ib(), xform,
						add_texture(ogf->texture(), texture_hint),
						add_shader(ogf->shader(), shader_hint),
						gamemtl->id);
			}
		}
		delete entity;
skip:;
	}
	spawns.erase(last, spawns.end());
}